

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPCollisionList::Timeout
          (RTPCollisionList *this,RTPTime *currenttime,RTPTime *timeoutdelay)

{
  iterator __position;
  double dVar1;
  
  dVar1 = currenttime->m_t - timeoutdelay->m_t;
  __position._M_node =
       (this->addresslist).
       super__List_base<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  while (__position._M_node != (_List_node_base *)&this->addresslist) {
    if (dVar1 < (double)__position._M_node[1]._M_prev ||
        dVar1 == (double)__position._M_node[1]._M_prev) {
      __position._M_node = (__position._M_node)->_M_next;
    }
    else {
      RTPDelete<jrtplib::RTPAddress>
                ((RTPAddress *)__position._M_node[1]._M_next,(this->super_RTPMemoryObject).mgr);
      __position = std::__cxx11::
                   list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
                   ::erase(&this->addresslist,__position._M_node);
    }
  }
  return;
}

Assistant:

void RTPCollisionList::Timeout(const RTPTime &currenttime,const RTPTime &timeoutdelay)
{
	std::list<AddressAndTime>::iterator it;
	RTPTime checktime = currenttime;
	checktime -= timeoutdelay;
	
	it = addresslist.begin();
	while(it != addresslist.end())
	{
		if ((*it).recvtime < checktime) // timeout
		{
			RTPDelete((*it).addr,GetMemoryManager());
			it = addresslist.erase(it);	
		}
		else
			it++;
	}
}